

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

WriteNLResult *
mp::WriteNLFile<mp::NLW2_NLFeeder_C_Impl>
          (WriteNLResult *__return_storage_ptr__,string *namebase,NLW2_NLFeeder_C_Impl *nlf,
          NLUtils *utl)

{
  long lVar1;
  NLHeader *pNVar2;
  undefined8 *puVar3;
  byte bVar4;
  NLHeader in_stack_fffffffffffffc48;
  NLW2_WriteNLResultCode local_2a4;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> writer;
  NLHeader h;
  
  bVar4 = 0;
  NLW2_NLFeeder_C_Impl::Header(&h,nlf);
  if (h.super_NLInfo.super_NLInfo_C.format == 0) {
    pNVar2 = &h;
    puVar3 = (undefined8 *)&stack0xfffffffffffffc48;
    for (lVar1 = 0x22; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *(undefined8 *)&(pNVar2->super_NLProblemInfo).super_NLProblemInfo_C;
      pNVar2 = (NLHeader *)((long)pNVar2 + (ulong)bVar4 * -0x10 + 8);
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::NLWriter2
              (&writer,nlf,in_stack_fffffffffffffc48,utl);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
              (__return_storage_ptr__,&writer,namebase);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::~NLWriter2
              (&writer);
  }
  else {
    memcpy(&writer.feeder_,&h,0x110);
    writer.header_.super_NLInfo.super_NLInfo_C.flags = 0;
    writer.num_vars_and_exprs_ = 0;
    writer.maxLen_ColName_ = 0;
    writer.maxLen_UnvName_ = 0;
    writer.maxLen_FixName_ = 0;
    local_2a4 = NLW2_WriteNL_Unset;
    writer.super_FormatterType.utils_ = utl;
    writer.super_FormatterType._8_8_ = nlf;
    std::
    pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<NLW2_WriteNLResultCode,_const_char_(&)[1],_true>
              ((pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&writer.nm,&local_2a4,(char (*) [1])0x1195e4);
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)
               &writer,namebase);
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::~NLWriter2
              ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)
               &writer);
  }
  return __return_storage_ptr__;
}

Assistant:

inline WriteNLResult WriteNLFile(
    const std::string& namebase,
    NLFeeder& nlf, NLUtils& utl) {
  auto h = nlf.Header();
  if (NLHeader::TEXT == h.format) {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::TextFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  } else {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::BinaryFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  }
}